

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O0

void __thiscall
S2VertexIdLaxLoopShape::S2VertexIdLaxLoopShape
          (S2VertexIdLaxLoopShape *this,vector<int,_std::allocator<int>_> *vertex_ids,
          S2Point *vertex_array)

{
  S2Point *vertex_array_local;
  vector<int,_std::allocator<int>_> *vertex_ids_local;
  S2VertexIdLaxLoopShape *this_local;
  
  S2Shape::S2Shape(&this->super_S2Shape);
  (this->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2VertexIdLaxLoopShape_0062dfd8;
  std::unique_ptr<int[],std::default_delete<int[]>>::unique_ptr<std::default_delete<int[]>,void>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->vertex_ids_);
  Init(this,vertex_ids,vertex_array);
  return;
}

Assistant:

S2VertexIdLaxLoopShape::S2VertexIdLaxLoopShape(
    const std::vector<int32>& vertex_ids, const S2Point* vertex_array) {
  Init(vertex_ids, vertex_array);
}